

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O2

void __thiscall FieldType::~FieldType(FieldType *this)

{
  std::vector<FieldType,_std::allocator<FieldType>_>::~vector(&this->templateTypes);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FieldType(const std::string &type) {
        const char *start = type.c_str();
        this->parse(start);
    }